

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O3

bool __thiscall
Refal2::COperationsExecuter::matchLeftDuplicateSaveToTable_WV
          (COperationsExecuter *this,TTableIndex origin)

{
  int iVar1;
  CUnitNode *pCVar2;
  CUnitNode *pCVar3;
  CNode<Refal2::CUnit> *this_00;
  bool bVar4;
  CUnitNode *pCVar5;
  CUnitNode *unit;
  
  pCVar2 = this->left;
  unit = this->table[origin];
  pCVar3 = this->table[(long)origin + 1];
  pCVar5 = pCVar2;
  if (unit != pCVar3->next) {
    do {
      this_00 = this->left->next;
      this->left = this_00;
      if (this_00 == (CNode<Refal2::CUnit> *)0x0) {
        __assert_fail("left != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/OperationsExecuter.h"
                      ,0x104,"bool Refal2::COperationsExecuter::shiftLeft()");
      }
      if ((this_00 == this->right) ||
         (bVar4 = CUnit::IsEqualWith(&this_00->super_CUnit,&unit->super_CUnit), !bVar4)) {
        return false;
      }
      unit = unit->next;
    } while (unit != pCVar3->next);
    pCVar5 = this->left;
  }
  iVar1 = this->tableTop;
  if (iVar1 < (((this->super_CExecutionContext).Program.
                super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_CCompilationContext).maxTableSize) {
    this->table[iVar1] = pCVar2->next;
    this->tableTop = iVar1 + 1;
    if (iVar1 + 1 <
        (((this->super_CExecutionContext).Program.
          super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_CCompilationContext).maxTableSize) {
      this->table[(long)iVar1 + 1] = pCVar5;
      this->tableTop = iVar1 + 2;
      return true;
    }
  }
  __assert_fail("tableTop < Program->MaxTableSize()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/OperationsExecuter.h"
                ,0xef,"void Refal2::COperationsExecuter::saveToTable(CUnitNode *const)");
}

Assistant:

inline bool COperationsExecuter::matchLeftDuplicateSaveToTable_WV(
	const TTableIndex origin )
{
	CUnitNode* originLeft = table[origin];
	CUnitNode* const originRight = table[origin + 1];
	CUnitNode* valueBegin = left;
	for( ; originLeft != originRight->Next();
		originLeft = originLeft->Next() )
	{
		if( !shiftLeft() || !left->IsEqualWith( *originLeft ) ) {
			return false;
		}
	}
	saveToTable( valueBegin->Next(), left );
	return true;
}